

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O2

void __thiscall mario::TcpClient::removeConnection(TcpClient *this,TcpConnectionPtr *conn)

{
  EventLoop *this_00;
  Writer *pWVar1;
  undefined1 auStack_c8 [32];
  TcpClient *local_a8;
  undefined8 local_a0;
  Writer local_98;
  
  EventLoop::assertInLoopThread(this->_loop);
  pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  std::__shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->_connection).
              super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  this_00 = this->_loop;
  local_a8 = (TcpClient *)TcpConnection::connectDestroyed;
  local_a0 = 0;
  std::_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>::
  _Bind<std::shared_ptr<mario::TcpConnection>const&>
            ((_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()> *)
             auStack_c8,(offset_in_TcpConnection_to_subr *)&local_a8,conn);
  std::function<void()>::
  function<std::_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>,void>
            ((function<void()> *)&local_98,
             (_Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()> *)
             auStack_c8);
  EventLoop::queueInLoop(this_00,(Functor *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_c8 + 0x18));
  if ((this->_retry == true) && (this->_connect == true)) {
    local_98._vptr_Writer = (_func_int **)&PTR__Writer_00134ae0;
    local_98.m_msg = (LogMessage *)0x0;
    local_98.m_level = Info;
    local_98.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/TcpClient.cpp"
    ;
    local_98.m_line = 0x76;
    local_98.m_func = "void mario::TcpClient::removeConnection(const TcpConnectionPtr &)";
    local_98.m_verboseLevel = 0;
    local_98.m_logger = (Logger *)0x0;
    local_98.m_proceed = false;
    local_98.m_messageBuilder.m_logger = (Logger *)0x0;
    local_98.m_messageBuilder.m_containerLogSeperator = "";
    local_98.m_dispatchAction = NormalLog;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar1 = el::base::Writer::construct(&local_98,1,"default");
    pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [21])"TcpClient::connect [");
    local_a8 = this;
    pWVar1 = el::base::Writer::operator<<(pWVar1,&local_a8);
    pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [21])"] - Reconnecting to ");
    InetAddress::toHostPort_abi_cxx11_
              ((string *)auStack_c8,
               &((this->_connector).super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_serverAddr);
    el::base::Writer::operator<<
              (pWVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_c8);
    std::__cxx11::string::~string((string *)auStack_c8);
    el::base::Writer::~Writer(&local_98);
    Connector::restart((this->_connector).
                       super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void TcpClient::removeConnection(const TcpConnectionPtr& conn) {
    _loop->assertInLoopThread();
    {
        MutexLockGuard lock(_mutex);
        _connection.reset();
    }
    _loop->queueInLoop(
            std::bind(&TcpConnection::connectDestroyed, conn)
            );
    if (_retry && _connect) {
        LOG(INFO) << "TcpClient::connect [" << this << "] - Reconnecting to "
            << _connector->serverAddress().toHostPort();
        _connector->restart();
    }
}